

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O0

bool API::checkDelete(STMT *stmt,int pos)

{
  int iVar1;
  int iVar2;
  value_type pTVar3;
  bool bVar4;
  ostream *poVar5;
  reference ppTVar6;
  ulong uVar7;
  size_type sVar8;
  reference pvVar9;
  pointer ppVar10;
  reference pvVar11;
  reference pvVar12;
  void *this;
  int checkType;
  int insertType;
  _Self local_38;
  iterator it;
  int i;
  bool error;
  TableInfo *info;
  int pos_local;
  STMT *stmt_local;
  
  if (pos < 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"delete fail,table ");
    poVar5 = std::operator<<(poVar5,(string *)&stmt->tableName);
    poVar5 = std::operator<<(poVar5," does not exist");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    stmt_local._7_1_ = false;
  }
  else {
    ppTVar6 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                        (&CM.TableInfoList,(long)pos);
    pTVar3 = *ppTVar6;
    it._M_node._7_1_ = 0;
    for (it._M_node._0_4_ = 0; uVar7 = (ulong)(int)it._M_node,
        sVar8 = std::vector<condition,_std::allocator<condition>_>::size(stmt->c_list),
        uVar7 < sVar8; it._M_node._0_4_ = (int)it._M_node + 1) {
      pvVar9 = std::vector<condition,_std::allocator<condition>_>::at
                         (stmt->c_list,(long)(int)it._M_node);
      local_38._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::find(&pTVar3->getID,&pvVar9->colunmName);
      _checkType = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::end(&pTVar3->getID);
      bVar4 = std::operator==(&local_38,(_Self *)&checkType);
      if (bVar4) {
        poVar5 = std::operator<<((ostream *)&std::cout,"colunm ");
        pvVar9 = std::vector<condition,_std::allocator<condition>_>::at
                           (stmt->c_list,(long)(int)it._M_node);
        poVar5 = std::operator<<(poVar5,(string *)&pvVar9->colunmName);
        poVar5 = std::operator<<(poVar5,"does not exist");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        return false;
      }
      ppVar10 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                ::operator->(&local_38);
      iVar1 = ppVar10->second;
      pvVar9 = std::vector<condition,_std::allocator<condition>_>::at
                         (stmt->c_list,(long)(int)it._M_node);
      pvVar9->colunmID = iVar1;
      pvVar9 = std::vector<condition,_std::allocator<condition>_>::at
                         (stmt->c_list,(long)(int)it._M_node);
      iVar1 = pvVar9->type;
      ppVar10 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                ::operator->(&local_38);
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&pTVar3->type,(long)ppVar10->second);
      iVar2 = *pvVar11;
      if (iVar1 == iVar2) {
LAB_001509a5:
        if ((it._M_node._7_1_ & 1) != 0) {
          poVar5 = std::operator<<((ostream *)&std::cout,"error occured");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          return false;
        }
      }
      else if (((iVar2 < 0x1d4c1) || (iVar1 < 0x1d4c1)) || (iVar2 < iVar1)) {
        pvVar12 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&pTVar3->attributeName,(long)(int)it._M_node);
        poVar5 = std::operator<<((ostream *)&std::cout,(string *)pvVar12);
        poVar5 = std::operator<<(poVar5," type does not match");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<((ostream *)&std::cout,"insert type is ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
        poVar5 = std::operator<<(poVar5," while check type is ");
        this = (void *)std::ostream::operator<<(poVar5,iVar2);
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
        it._M_node._7_1_ = 1;
        goto LAB_001509a5;
      }
    }
    stmt_local._7_1_ = true;
  }
  return stmt_local._7_1_;
}

Assistant:

bool API::checkDelete(STMT* stmt,int pos){
    if(pos < 0){
        std::cout<<"delete fail,table "<<stmt->tableName<<" does not exist"<<std::endl;
        return false;
    }
    TableInfo* info = CM.TableInfoList[pos];
    //增加id 增加类型检查
    bool error = false;
    for(int i = 0 ; i < stmt->c_list->size() ; i ++){
        //增加colunmid
        auto it = info->getID.find(stmt->c_list->at(i).colunmName);
        if(it==info->getID.end()){
            std::cout<<"colunm "<< stmt->c_list->at(i).colunmName << "does not exist"<<std::endl;
            return false;
        }
        else{
            stmt->c_list->at(i).colunmID = it->second;
        }
        //先检查类型
        int insertType = stmt->c_list->at(i).type;
        int checkType = info->type[it->second];
        if(insertType != checkType ){
            if(checkType > 120000 && insertType > 120000 && insertType <= checkType)continue;
            std::cout<<info->attributeName[i]<<" type does not match"<< std::endl;
            std::cout << "insert type is "<<insertType<<" while check type is "<<checkType<<std::endl;
            error = true;
        }
        if(error){
            std::cout<<"error occured"<<std::endl;
            return false;
        }
    }
    return true;
}